

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O1

void IoTHubTransport_AMQP_Common_Unsubscribe_DeviceTwin(IOTHUB_DEVICE_HANDLE handle)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  LIST_ITEM_HANDLE item_handle;
  void *pvVar4;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  char *pcVar5;
  
  if (handle == (IOTHUB_DEVICE_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar5 = "Invalid argument (handle is NULL";
      iVar2 = 0x659;
LAB_0012e5f2:
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                 ,"IoTHubTransport_AMQP_Common_Unsubscribe_DeviceTwin",iVar2,1,pcVar5);
      return;
    }
  }
  else {
    sVar3 = get_number_of_registered_devices((AMQP_TRANSPORT_INSTANCE *)handle);
    if (sVar3 == 1) {
      item_handle = singlylinkedlist_get_head_item
                              (*(SINGLYLINKEDLIST_HANDLE *)((long)handle + 0x28));
      do {
        if (item_handle == (LIST_ITEM_HANDLE)0x0) {
          return;
        }
        pvVar4 = singlylinkedlist_item_get_value(item_handle);
        if (pvVar4 == (void *)0x0) {
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
            iVar2 = 0x66d;
            pcVar5 = "Failed retrieving registered device information";
            goto LAB_0012e57a;
          }
LAB_0012e581:
          bVar1 = false;
        }
        else {
          iVar2 = amqp_device_unsubscribe_for_twin_updates
                            (*(AMQP_DEVICE_HANDLE *)((long)pvVar4 + 8));
          if (iVar2 == 0) {
            item_handle = singlylinkedlist_get_next_item(item_handle);
            bVar1 = true;
          }
          else {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) goto LAB_0012e581;
            iVar2 = 0x672;
            pcVar5 = "Failed unsubscribing for device Twin updates";
LAB_0012e57a:
            bVar1 = false;
            (*UNRECOVERED_JUMPTABLE)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                       ,"IoTHubTransport_AMQP_Common_Unsubscribe_DeviceTwin",iVar2,1,pcVar5);
          }
        }
      } while (bVar1);
    }
    else {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar5 = "Device Twin not supported on device multiplexing scenario";
        iVar2 = 0x661;
        goto LAB_0012e5f2;
      }
    }
  }
  return;
}

Assistant:

void IoTHubTransport_AMQP_Common_Unsubscribe_DeviceTwin(IOTHUB_DEVICE_HANDLE handle)
{
    if (handle == NULL)
    {
        LogError("Invalid argument (handle is NULL");
    }
    else
    {
        AMQP_TRANSPORT_INSTANCE* transport = (AMQP_TRANSPORT_INSTANCE*)handle;

        if (get_number_of_registered_devices(transport) != 1)
        {
            LogError("Device Twin not supported on device multiplexing scenario");
        }
        else
        {
            LIST_ITEM_HANDLE list_item = singlylinkedlist_get_head_item(transport->registered_devices);

            while (list_item != NULL)
            {
                AMQP_TRANSPORT_DEVICE_INSTANCE* registered_device;

                if ((registered_device = (AMQP_TRANSPORT_DEVICE_INSTANCE*)singlylinkedlist_item_get_value(list_item)) == NULL)
                {
                    LogError("Failed retrieving registered device information");
                    break;
                }
                else if (amqp_device_unsubscribe_for_twin_updates(registered_device->device_handle) != RESULT_OK)
                {
                    LogError("Failed unsubscribing for device Twin updates");
                    break;
                }

                list_item = singlylinkedlist_get_next_item(list_item);
            }
        }
    }
}